

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_connection.hpp
# Opt level: O3

void __thiscall cpp_client::Connection_internal::~Connection_internal(Connection_internal *this)

{
  pointer pcVar1;
  
  if (this->sock_ != -1) {
    close(this->sock_);
  }
  pcVar1 = (this->buffer_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->buffer_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Connection_internal()
   {
      if(sock_ != -1)
      {
         close(sock_);
      }
   }